

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_posix::collator<char>::do_transform_abi_cxx11_
          (collator<char> *this,char_type *b,char_type *e)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RCX;
  char *in_RDX;
  string_type *in_RDI;
  size_t n;
  vector<char,_std::allocator<char>_> buf;
  string_type s;
  locale_t in_stack_fffffffffffffed8;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  allocator *paVar4;
  allocator_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  allocator local_81;
  size_t local_80;
  allocator<char> local_71;
  vector<char,_std::allocator<char>_> local_70;
  allocator local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RDX,in_RCX - (long)in_RDX,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::allocator<char>::~allocator(&local_71);
  std::vector<char,_std::allocator<char>_>::front
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffee0);
  std::__cxx11::string::c_str();
  std::vector<char,_std::allocator<char>_>::size(&local_70);
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffee0);
  sVar1 = coll_traits<char>::xfrm
                    ((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_80 = sVar1;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_70);
  if (sVar2 < sVar1) {
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef0 =
         (allocator_type *)
         std::vector<char,_std::allocator<char>_>::front
                   ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              (in_stack_fffffffffffffee0);
    coll_traits<char>::xfrm
              ((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  pvVar3 = std::vector<char,_std::allocator<char>_>::front
                     ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffee0);
  paVar4 = &local_81;
  sVar1 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar3,sVar1,paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

virtual string_type do_transform(char_type const *b,char_type const *e) const
    {
        string_type s(b,e-b);
        std::vector<char_type> buf((e-b)*2+1);
        size_t n = coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),buf.size(),*lc_);
        if(n>buf.size()) {
            buf.resize(n);
            coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),n,*lc_);
        }
        return string_type(&buf.front(),n);
    }